

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

yy_state_type __thiscall yyFlexLexer::yy_get_previous_state(yyFlexLexer *this)

{
  short *psVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  
  iVar2 = this->yy_start;
  pbVar3 = (byte *)(this->super_FlexLexer).yytext;
  if (pbVar3 < this->yy_c_buf_p) {
    do {
      if ((ulong)*pbVar3 == 0) {
        bVar7 = 1;
      }
      else {
        bVar7 = ""[*pbVar3];
      }
      lVar4 = (long)iVar2;
      if (yy_accept[lVar4] != 0) {
        this->yy_last_accepting_state = iVar2;
        this->yy_last_accepting_cpos = (char *)pbVar3;
      }
      uVar5 = (ulong)bVar7;
      lVar6 = (long)yy_base[lVar4] + uVar5;
      if (iVar2 != yy_chk[lVar6]) {
        do {
          if ((iVar2 == 0x2c) || (iVar2 == 0x10)) {
            bVar7 = ""[uVar5];
          }
          psVar1 = yy_def + lVar4;
          iVar2 = (int)*psVar1;
          lVar4 = (long)iVar2;
          uVar5 = (ulong)bVar7;
          lVar6 = (long)yy_base[lVar4] + uVar5;
        } while (*psVar1 != yy_chk[lVar6]);
      }
      iVar2 = (int)yy_nxt[lVar6];
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (byte *)this->yy_c_buf_p);
  }
  return iVar2;
}

Assistant:

yy_state_type yyFlexLexer::yy_get_previous_state()
/* %endif */
{
	yy_state_type yy_current_state;
	char *yy_cp;
    
/* %% [15.0] code to get the start state into yy_current_state goes here */
	yy_current_state = (yy_start);

	for ( yy_cp = (yytext_ptr) + YY_MORE_ADJ; yy_cp < (yy_c_buf_p); ++yy_cp )
		{
/* %% [16.0] code to find the next state goes here */
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			(yy_last_accepting_state) = yy_current_state;
			(yy_last_accepting_cpos) = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 76 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}